

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_dump.hpp
# Opt level: O2

string * __thiscall
ELFIO::dump::find_value_in_table<ELFIO::version_table_t[2],unsigned_int>
          (string *__return_storage_ptr__,dump *this,version_table_t (*table) [2],uint *key)

{
  Elf64_Word EVar1;
  allocator<char> local_19;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"?",&local_19)
  ;
  EVar1 = (*table)[0].key;
  if ((*(Elf64_Word *)this == EVar1) || (*(Elf64_Word *)(this + 0x10) == EVar1)) {
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string static find_value_in_table( const T& table, const K& key )
    {
        std::string res = "?";
        for ( unsigned int i = 0; i < sizeof( table ) / sizeof( table[0] );
              ++i ) {
            if ( table[i].key == key ) {
                res = table[i].str;
                break;
            }
        }

        return res;
    }